

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bdfdrivr.c
# Opt level: O1

FT_Error BDF_Size_Request(FT_Size size,FT_Size_Request req)

{
  FT_Face face;
  long lVar1;
  long lVar2;
  FT_Error FVar3;
  bdf_font_t *bdffont;
  bool bVar4;
  
  face = size->face;
  lVar2 = req->height;
  if ((ulong)req->vertResolution != 0) {
    lVar1 = lVar2 * (ulong)req->vertResolution + 0x24;
    lVar2 = lVar1 >> 0x3f;
    lVar2 = (lVar1 / 0x12 + lVar2 >> 2) - lVar2;
  }
  lVar1 = face[1].face_flags;
  lVar2 = lVar2 + 0x20 >> 6;
  bVar4 = false;
  if (req->type == FT_SIZE_REQUEST_TYPE_REAL_DIM) {
    bVar4 = lVar2 == *(long *)(lVar1 + 0x48) + *(long *)(lVar1 + 0x40);
    FVar3 = 0x17;
    if (bVar4) {
      FVar3 = 0;
    }
  }
  else if (req->type == FT_SIZE_REQUEST_TYPE_NOMINAL) {
    bVar4 = lVar2 == face->available_sizes->y_ppem + 0x20 >> 6;
    FVar3 = 0x17;
    if (bVar4) {
      FVar3 = 0;
    }
  }
  else {
    FVar3 = 7;
  }
  if (bVar4) {
    FVar3 = 0;
    FT_Select_Metrics(face,0);
    (size->metrics).ascender = *(long *)(lVar1 + 0x40) << 6;
    (size->metrics).descender = *(long *)(lVar1 + 0x48) * -0x40;
    (size->metrics).max_advance = (ulong)*(ushort *)(lVar1 + 8) << 6;
  }
  return FVar3;
}

Assistant:

FT_CALLBACK_DEF( FT_Error )
  BDF_Size_Request( FT_Size          size,
                    FT_Size_Request  req )
  {
    FT_Face          face    = size->face;
    FT_Bitmap_Size*  bsize   = face->available_sizes;
    bdf_font_t*      bdffont = ( (BDF_Face)face )->bdffont;
    FT_Error         error   = FT_ERR( Invalid_Pixel_Size );
    FT_Long          height;


    height = FT_REQUEST_HEIGHT( req );
    height = ( height + 32 ) >> 6;

    switch ( req->type )
    {
    case FT_SIZE_REQUEST_TYPE_NOMINAL:
      if ( height == ( ( bsize->y_ppem + 32 ) >> 6 ) )
        error = FT_Err_Ok;
      break;

    case FT_SIZE_REQUEST_TYPE_REAL_DIM:
      if ( height == ( bdffont->font_ascent +
                       bdffont->font_descent ) )
        error = FT_Err_Ok;
      break;

    default:
      error = FT_THROW( Unimplemented_Feature );
      break;
    }

    if ( error )
      return error;
    else
      return BDF_Size_Select( size, 0 );
  }